

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O1

basic_binary_ostream<fail_flag_serialization_policy> *
detail::operator<<(ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                   *stream,person *value)

{
  ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
  *poVar1;
  size_type sVar2;
  long lVar3;
  size_t __n;
  ulong uVar4;
  
  if ((stream->
      super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow != true) {
    uVar4 = *(long *)(stream + -8) - (long)*(size_type **)(stream + -0x10);
    if ((long)uVar4 < 0) {
      __assert_fail("diff >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/src/include/span.hpp"
                    ,0x22,"size_t span<std::byte>::size() const [T = std::byte]");
    }
    sVar2 = (value->name)._M_string_length;
    poVar1 = stream + -0x10;
    if (uVar4 < sVar2 + 0xc) {
      (stream->
      super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
    }
    else {
      **(size_type **)(stream + -0x10) = sVar2;
      lVar3 = *(long *)poVar1;
      *(void **)poVar1 = (void *)(lVar3 + 8);
      __n = (value->name)._M_string_length;
      memcpy((void *)(lVar3 + 8),(value->name)._M_dataplus._M_p,__n);
      lVar3 = *(long *)poVar1;
      *(size_t *)poVar1 = lVar3 + __n;
      *(int *)(lVar3 + __n) = value->age;
      *(long *)poVar1 = *(long *)poVar1 + 4;
    }
  }
  return (basic_binary_ostream<fail_flag_serialization_policy> *)(stream + -0x10);
}

Assistant:

StreamDerived& operator<<(ostream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T const& value) {
        if (stream.overflow) return stream.base();

        auto const size = get_serialized_size(value);
        if (size > stream.span().size()) {
            stream.overflow = true;
            return stream.base();
        }
        serialize(value, stream.span());
        return stream.base();
    }